

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _listNode.hpp
# Opt level: O2

void __thiscall
ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
listNode(listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *other)

{
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  operator=(this,other);
  return;
}

Assistant:

listNode(listNode const & other): data() {
		*this = other;
	}